

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QAbstractTextDocumentLayout::Selection>::
emplace<QAbstractTextDocumentLayout::Selection_const&>
          (QMovableArrayOps<QAbstractTextDocumentLayout::Selection> *this,qsizetype i,
          Selection *args)

{
  Selection **ppSVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  Selection *pSVar4;
  Selection *pSVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_80;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
           super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004ce84c:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)&local_58,&args->cursor);
    QTextFormat::QTextFormat((QTextFormat *)&puStack_50,&(args->format).super_QTextFormat);
    bVar6 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
            super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size != 0;
    QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::detachAndGrow
              ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)this,
               (uint)(i == 0 && bVar6),1,(Selection **)0x0,
               (QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)0x0);
    if (i == 0 && bVar6) {
      pSVar4 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
               super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr;
      QTextCursor::QTextCursor(&pSVar4[-1].cursor,(QTextCursor *)&local_58);
      QTextFormat::QTextFormat(&pSVar4[-1].format.super_QTextFormat,(QTextFormat *)&puStack_50);
      ppSVar1 = &(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                 super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr;
      *ppSVar1 = *ppSVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pSVar5 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
               super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr;
      pSVar4 = pSVar5 + i + 1;
      local_80.nInserts = 1;
      local_80.bytes =
           ((this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
            super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size - i) * 0x18;
      local_80.data = (QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)this;
      local_80.displaceTo = pSVar4;
      memmove(pSVar4,pSVar5 + i,local_80.bytes);
      QTextCursor::QTextCursor(&pSVar5[i].cursor,(QTextCursor *)&local_58);
      QTextFormat::QTextFormat(&pSVar5[i].format.super_QTextFormat,(QTextFormat *)&puStack_50);
      local_80.displaceFrom = pSVar4;
      Inserter::~Inserter(&local_80);
    }
    QTextFormat::~QTextFormat((QTextFormat *)&puStack_50);
    QTextCursor::~QTextCursor((QTextCursor *)&local_58);
  }
  else {
    if (((this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
         super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size == i) &&
       (pSVar4 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                 super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pSVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x5555555555555555)) {
      QTextCursor::QTextCursor(&pSVar4[i].cursor,&args->cursor);
      QTextFormat::QTextFormat
                (&pSVar4[i].format.super_QTextFormat,&(args->format).super_QTextFormat);
    }
    else {
      if ((i != 0) ||
         (pSVar4 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                   super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr,
         (Selection *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pSVar4)) goto LAB_004ce84c;
      QTextCursor::QTextCursor(&pSVar4[-1].cursor,&args->cursor);
      QTextFormat::QTextFormat
                (&pSVar4[-1].format.super_QTextFormat,&(args->format).super_QTextFormat);
      ppSVar1 = &(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                 super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr;
      *ppSVar1 = *ppSVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
              super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }